

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseLifLayer.cpp
# Opt level: O0

ILayer * __thiscall DenseLifLayer::Relax(DenseLifLayer *this,Time time)

{
  bool bVar1;
  vector<INeuron_*,_std::allocator<INeuron_*>_> *this_00;
  reference ppIVar2;
  INeuron *neuron;
  iterator __end1;
  iterator __begin1;
  vector<INeuron_*,_std::allocator<INeuron_*>_> *__range1;
  Time time_local;
  DenseLifLayer *this_local;
  
  this_00 = &(this->super_ILayer).neurons;
  __end1 = std::vector<INeuron_*,_std::allocator<INeuron_*>_>::begin(this_00);
  neuron = (INeuron *)std::vector<INeuron_*,_std::allocator<INeuron_*>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<INeuron_**,_std::vector<INeuron_*,_std::allocator<INeuron_*>_>_>
                                *)&neuron);
    if (!bVar1) break;
    ppIVar2 = __gnu_cxx::
              __normal_iterator<INeuron_**,_std::vector<INeuron_*,_std::allocator<INeuron_*>_>_>::
              operator*(&__end1);
    (*(*ppIVar2)->_vptr_INeuron[6])(time,*ppIVar2,0);
    __gnu_cxx::__normal_iterator<INeuron_**,_std::vector<INeuron_*,_std::allocator<INeuron_*>_>_>::
    operator++(&__end1);
  }
  return &this->super_ILayer;
}

Assistant:

ILayer &DenseLifLayer::Relax( SPIKING_NN::Time time )
{
    for ( auto neuron : neurons ) {
        neuron->RelaxOutput( time, false );
    }
    return *this;
}